

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O3

void __thiscall QCollapsibleFrame::setTitle(QCollapsibleFrame *this,QWidget *title)

{
  QCollapsibleFramePrivate *pQVar1;
  bool toggled;
  QWidget *pQVar2;
  Data *pDVar3;
  QWeakPointer<QObject> local_30;
  
  pDVar3 = (this->d->title).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar2 = (QWidget *)0x0;
  }
  else {
    pQVar2 = (QWidget *)(this->d->title).wp.value;
  }
  if (pQVar2 != title) {
    takeTitle(this);
    if (title != (QWidget *)0x0) {
      pQVar1 = this->d;
      local_30.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)title);
      local_30.value = (QObject *)title;
      QWeakPointer<QObject>::operator=(&(pQVar1->title).wp,&local_30);
      pDVar3 = local_30.d;
      if (local_30.d != (ExternalRefCountData *)0x0) {
        LOCK();
        *(int *)local_30.d = *(int *)local_30.d + -1;
        UNLOCK();
        if (*(int *)local_30.d == 0) {
          if (local_30.d == (ExternalRefCountData *)0x0) {
            pDVar3 = (ExternalRefCountData *)0x0;
          }
          else {
            QtSharedPointer::ExternalRefCountData::~ExternalRefCountData(local_30.d);
          }
          operator_delete(pDVar3);
        }
      }
      QBoxLayout::addWidget(this->d->horizontalLayout,title,1,0);
      pQVar1 = this->d;
      toggled = (bool)QAbstractButton::isChecked();
      QCollapsibleFramePrivate::button_toggled(pQVar1,toggled);
    }
    titleChanged(this);
  }
  return;
}

Assistant:

void QCollapsibleFrame::setTitle(QWidget *title) {
    if (d->title != title) {
        /*delete*/ takeTitle();

        if (title) {
            d->title = title;
            d->horizontalLayout->addWidget(title, 1);
            d->button_toggled(d->button->isChecked());
        }

        Q_EMIT titleChanged();
    }
}